

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O1

EVaction INT_REVassoc_immediate_action(CMConnection conn,EVstone stone,char *action_spec)

{
  int condition;
  CMFormat format;
  EVassoc_immediate_action_request request;
  EV_int_response response;
  undefined8 local_48;
  char *pcStack_40;
  undefined1 local_30 [4];
  EVaction local_2c;
  
  local_48 = 0;
  pcStack_40 = (char *)0x0;
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVassoc_immediate_action_req_formats);
  local_48 = CONCAT44(stone,condition);
  pcStack_40 = action_spec;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVassoc_immediate_action_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,local_30);
  INT_CMwrite(conn,format,&local_48);
  INT_CMCondition_wait(conn->cm,condition);
  return local_2c;
}

Assistant:

extern EVaction
INT_REVassoc_immediate_action(CMConnection conn, EVstone stone, char *action_spec)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVassoc_immediate_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVassoc_immediate_action_req_formats);
    request.stone = stone;
    request.action_spec = action_spec;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVassoc_immediate_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVaction) response.ret;
}